

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_dnd_x.cxx
# Opt level: O0

int Fl::dnd(void)

{
  int iVar1;
  Fl_Window *pFVar2;
  Fl_Widget *pFVar3;
  char *pcVar4;
  undefined4 local_c8 [2];
  XButtonEvent msg;
  undefined1 auStack_60 [4];
  uint junk3;
  Window root;
  Window child;
  Fl_Window *new_local_window;
  undefined1 auStack_40 [4];
  int new_version;
  Window new_window;
  undefined4 local_30;
  int dest_y;
  int dest_x;
  int dndversion;
  Fl_Window *local_window;
  Window target_window;
  Window source_window;
  Fl_Window *source_fl_win;
  
  source_window = (Window)first_window();
  pFVar2 = first_window();
  Fl_Window::cursor(pFVar2,FL_CURSOR_MOVE);
  pFVar2 = first_window();
  target_window = fl_xid(pFVar2);
  fl_local_grab = grabfunc;
  local_window = (Fl_Window *)0x0;
  _dest_x = (Fl_Window *)0x0;
  dest_y = 4;
  XSetSelectionOwner(fl_display,fl_XdndSelection,fl_message_window,fl_event_time);
  do {
    pFVar3 = pushed();
    if (pFVar3 == (Fl_Widget *)0x0) {
      if (_dest_x == (Fl_Window *)0x0) {
        if (dest_y == 0) {
          if (local_window != (Fl_Window *)0x0) {
            local_c8[0] = 4;
            msg.display = (Display *)local_window;
            msg.window = *(Window *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10);
            msg.root = 0;
            msg.subwindow = fl_event_time + 1;
            msg.time._0_4_ = local_30;
            msg.time._4_4_ = new_window._4_4_;
            msg.x = e_x_root;
            msg.y = e_y_root;
            msg.x_root = 0;
            msg.y_root = 2;
            XSendEvent(fl_display,local_window,0,0,local_c8);
            msg.subwindow = msg.subwindow + 1;
            msg.x_root = 0x200;
            local_c8[0] = 5;
            XSendEvent(fl_display,local_window,0,0,local_c8);
          }
        }
        else {
          fl_sendClientMessage((Window)local_window,fl_XdndDrop,target_window,0,fl_event_time,0,0);
        }
      }
      else {
        fl_i_own_selection[0] = '\x01';
        iVar1 = local_handle(0x17,_dest_x);
        if (iVar1 != 0) {
          pFVar3 = belowmouse();
          paste(pFVar3,0);
        }
      }
      fl_local_grab = (_func_int_int *)0x0;
      Fl_Window::cursor((Fl_Window *)source_window,FL_CURSOR_DEFAULT);
      return 1;
    }
    _auStack_40 = (Fl_Window *)0x0;
    new_local_window._4_4_ = 0;
    child = 0;
    root = *(Window *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10);
    do {
      pFVar2 = (Fl_Window *)fl_display;
      XQueryPointer(fl_display,root,auStack_60,&root,&e_x_root,&e_y_root,&local_30,
                    (long)&new_window + 4,&msg.field_0x5c);
      if (root == 0) {
        if (_auStack_40 == (Fl_Window *)0x0) {
          pFVar2 = (Fl_Window *)auStack_60;
          new_local_window._4_4_ = dnd_aware((Window *)pFVar2);
          if (new_local_window._4_4_ != 0) {
            _auStack_40 = _auStack_60;
          }
        }
        break;
      }
      _auStack_40 = (Fl_Window *)root;
      pFVar2 = (Fl_Window *)root;
      child = (Window)fl_find(root);
      if ((Fl_Window *)child != (Fl_Window *)0x0) break;
      pFVar2 = (Fl_Window *)auStack_40;
      new_local_window._4_4_ = dnd_aware((Window *)pFVar2);
    } while (new_local_window._4_4_ == 0);
    if (_auStack_40 != local_window) {
      if (_dest_x == (Fl_Window *)0x0) {
        if (dest_y != 0) {
          fl_sendClientMessage((Window)local_window,fl_XdndLeave,target_window,0,0,0,0);
          pFVar2 = local_window;
        }
      }
      else {
        pFVar2 = (Fl_Window *)0x16;
        local_handle(0x16,_dest_x);
      }
      dest_y = new_local_window._4_4_;
      local_window = _auStack_40;
      _dest_x = (Fl_Window *)child;
      if (child == 0) {
        if (new_local_window._4_4_ != 0) {
          iVar1 = strncmp(fl_selection_buffer[0],"file:///",8);
          if (((((((iVar1 == 0) || (iVar1 = strncmp(fl_selection_buffer[0],"ftp://",6), iVar1 == 0))
                 || (iVar1 = strncmp(fl_selection_buffer[0],"http://",7), iVar1 == 0)) ||
                ((iVar1 = strncmp(fl_selection_buffer[0],"https://",8), iVar1 == 0 ||
                 (iVar1 = strncmp(fl_selection_buffer[0],"ipp://",6), iVar1 == 0)))) ||
               ((iVar1 = strncmp(fl_selection_buffer[0],"ldap:",5), iVar1 == 0 ||
                ((iVar1 = strncmp(fl_selection_buffer[0],"mailto:",7), iVar1 == 0 ||
                 (iVar1 = strncmp(fl_selection_buffer[0],"news:",5), iVar1 == 0)))))) ||
              (iVar1 = strncmp(fl_selection_buffer[0],"smb://",6), iVar1 == 0)) &&
             ((pcVar4 = strchr(fl_selection_buffer[0],0x20), pcVar4 == (char *)0x0 &&
              (pcVar4 = strstr(fl_selection_buffer[0],"\r\n"), pcVar4 != (char *)0x0)))) {
            pFVar2 = local_window;
            fl_sendClientMessage
                      ((Window)local_window,fl_XdndEnter,target_window,(long)(dest_y << 0x18),
                       fl_XdndURIList,0x1f,0);
          }
          else {
            pFVar2 = local_window;
            fl_sendClientMessage
                      ((Window)local_window,fl_XdndEnter,target_window,(long)(dest_y << 0x18),
                       fl_XaUtf8String,0,0);
          }
        }
      }
      else {
        pFVar2 = (Fl_Window *)0x14;
        local_handle(0x14,(Fl_Window *)child);
      }
    }
    if (_dest_x == (Fl_Window *)0x0) {
      if (dest_y != 0) {
        pFVar2 = local_window;
        fl_sendClientMessage
                  ((Window)local_window,fl_XdndPosition,target_window,0,
                   (long)(e_x_root << 0x10 | e_y_root),fl_event_time,fl_XdndActionCopy);
      }
    }
    else {
      pFVar2 = (Fl_Window *)0x15;
      local_handle(0x15,_dest_x);
    }
    wait(pFVar2);
  } while( true );
}

Assistant:

int Fl::dnd() {
  Fl_Window *source_fl_win = Fl::first_window();
  Fl::first_window()->cursor(FL_CURSOR_MOVE);
  Window source_window = fl_xid(Fl::first_window());
  fl_local_grab = grabfunc;
  Window target_window = 0;
  Fl_Window* local_window = 0;
  int dndversion = 4; int dest_x, dest_y;
  XSetSelectionOwner(fl_display, fl_XdndSelection, fl_message_window, fl_event_time);

  while (Fl::pushed()) {

    // figure out what window we are pointing at:
    Window new_window = 0; int new_version = 0;
    Fl_Window* new_local_window = 0;
    for (Window child = RootWindow(fl_display, fl_screen);;) {
      Window root; unsigned int junk3;
      XQueryPointer(fl_display, child, &root, &child,
		    &e_x_root, &e_y_root, &dest_x, &dest_y, &junk3);
      if (!child) {
	if (!new_window && (new_version = dnd_aware(root))) new_window = root;
	break;
      }
      new_window = child;
      if ((new_local_window = fl_find(child))) break;
      if ((new_version = dnd_aware(new_window))) break;
    }

    if (new_window != target_window) {
      if (local_window) {
	local_handle(FL_DND_LEAVE, local_window);
      } else if (dndversion) {
	fl_sendClientMessage(target_window, fl_XdndLeave, source_window);
      }
      dndversion = new_version;
      target_window = new_window;
      local_window = new_local_window;
      if (local_window) {
	local_handle(FL_DND_ENTER, local_window);
      } else if (dndversion) {
        // Send an X-DND message to the target window.  In order to
	// support dragging of files/URLs as well as arbitrary text,
	// we look at the selection buffer - if the buffer starts
	// with a common URI scheme, does not contain spaces, and
	// contains at least one CR LF, then we flag the data as
	// both a URI list (MIME media type "text/uri-list") and
	// plain text.  Otherwise, we just say it is plain text.
        if ((!strncmp(fl_selection_buffer[0], "file:///", 8) ||
	     !strncmp(fl_selection_buffer[0], "ftp://", 6) ||
	     !strncmp(fl_selection_buffer[0], "http://", 7) ||
	     !strncmp(fl_selection_buffer[0], "https://", 8) ||
	     !strncmp(fl_selection_buffer[0], "ipp://", 6) ||
	     !strncmp(fl_selection_buffer[0], "ldap:", 5) ||
	     !strncmp(fl_selection_buffer[0], "mailto:", 7) ||
	     !strncmp(fl_selection_buffer[0], "news:", 5) ||
	     !strncmp(fl_selection_buffer[0], "smb://", 6)) &&
	    !strchr(fl_selection_buffer[0], ' ') &&
	    strstr(fl_selection_buffer[0], "\r\n")) {
	  // Send file/URI list...
	  fl_sendClientMessage(target_window, fl_XdndEnter, source_window,
			       dndversion<<24, fl_XdndURIList, XA_STRING, 0);
        } else {
	  // Send plain text...
	  fl_sendClientMessage(target_window, fl_XdndEnter, source_window,
			       dndversion<<24, fl_XaUtf8String, 0, 0);
	}
      }
    }
    if (local_window) {
      local_handle(FL_DND_DRAG, local_window);
    } else if (dndversion) {
      fl_sendClientMessage(target_window, fl_XdndPosition, source_window,
			   0, (e_x_root<<16)|e_y_root, fl_event_time,
			   fl_XdndActionCopy);
    }
    Fl::wait();
  }

  if (local_window) {
    fl_i_own_selection[0] = 1;
    if (local_handle(FL_DND_RELEASE, local_window)) paste(*belowmouse(), 0);
  } else if (dndversion) {
    fl_sendClientMessage(target_window, fl_XdndDrop, source_window,
			 0, fl_event_time);
  } else if (target_window) {
    // fake a drop by clicking the middle mouse button:
    XButtonEvent msg;
    msg.type = ButtonPress;
    msg.window = target_window;
    msg.root = RootWindow(fl_display, fl_screen);
    msg.subwindow = 0;
    msg.time = fl_event_time+1;
    msg.x = dest_x;
    msg.y = dest_y;
    msg.x_root = Fl::e_x_root;
    msg.y_root = Fl::e_y_root;
    msg.state = 0x0;
    msg.button = Button2;
    XSendEvent(fl_display, target_window, False, 0L, (XEvent*)&msg);
    msg.time++;
    msg.state = 0x200;
    msg.type = ButtonRelease;
    XSendEvent(fl_display, target_window, False, 0L, (XEvent*)&msg);
  }

  fl_local_grab = 0;
  source_fl_win->cursor(FL_CURSOR_DEFAULT);
  return 1;
}